

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# demo_xor.cpp
# Opt level: O0

void print_net(string *tag,Net *xorNet,LabeledDataset *dataset)

{
  bool bVar1;
  PlainTextNetworkWriter *pPVar2;
  ostream *poVar3;
  Array *__v;
  undefined1 local_f0 [8];
  Array out;
  LabeledData s;
  DatasetIterator __end1;
  DatasetIterator __begin1;
  LabeledDataset *__range1;
  string local_80 [55];
  allocator local_49;
  string local_48 [32];
  PlainTextNetworkWriter local_28;
  LabeledDataset *local_20;
  LabeledDataset *dataset_local;
  Net *xorNet_local;
  string *tag_local;
  
  local_20 = dataset;
  dataset_local = (LabeledDataset *)xorNet;
  xorNet_local = (Net *)tag;
  notch::io::PlainTextNetworkWriter::PlainTextNetworkWriter(&local_28,(ostream *)&std::cout);
  pPVar2 = notch::io::PlainTextNetworkWriter::operator<<(&local_28,tag);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_48," net:\n\n",&local_49);
  pPVar2 = notch::io::PlainTextNetworkWriter::operator<<(pPVar2,(string *)local_48);
  pPVar2 = notch::io::PlainTextNetworkWriter::operator<<(pPVar2,(Net *)dataset_local);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_80,"\n",(allocator *)((long)&__range1 + 7));
  notch::io::PlainTextNetworkWriter::operator<<(pPVar2,(string *)local_80);
  std::__cxx11::string::~string(local_80);
  std::allocator<char>::~allocator((allocator<char> *)((long)&__range1 + 7));
  std::__cxx11::string::~string(local_48);
  std::allocator<char>::~allocator((allocator<char> *)&local_49);
  poVar3 = std::operator<<((ostream *)&std::cout,(string *)tag);
  std::operator<<(poVar3," out:\n");
  notch::core::LabeledDataset::begin((DatasetIterator *)&__end1.out_end,dataset);
  notch::core::LabeledDataset::end((DatasetIterator *)&s.label,dataset);
  while( true ) {
    bVar1 = notch::core::LabeledDataset::DatasetIterator::operator!=
                      ((DatasetIterator *)&__end1.out_end,(DatasetIterator *)&s.label);
    if (!bVar1) break;
    join_0x00000010_0x00000000_ =
         notch::core::LabeledDataset::DatasetIterator::operator*((DatasetIterator *)&__end1.out_end)
    ;
    __v = notch::core::Net::output((Net *)dataset_local,(Array *)out._M_data);
    notch::core::std::valarray<float>::valarray((valarray<float> *)local_f0,__v);
    poVar3 = notch::io::operator<<((ostream *)&std::cout,(Array *)out._M_data);
    poVar3 = std::operator<<(poVar3," -> ");
    poVar3 = notch::io::operator<<(poVar3,(Array *)local_f0);
    std::operator<<(poVar3,"\n");
    notch::core::std::valarray<float>::~valarray((valarray<float> *)local_f0);
    notch::core::LabeledDataset::DatasetIterator::operator++((DatasetIterator *)&__end1.out_end);
  }
  std::operator<<((ostream *)&std::cout,"\n");
  return;
}

Assistant:

void print_net(string tag, Net &xorNet, LabeledDataset dataset) {
    PlainTextNetworkWriter(cout) << tag << " net:\n\n" << xorNet << "\n";
    cout << tag << " out:\n";
    for (auto s : dataset) {
        auto out = xorNet.output(s.data);
        cout << s.data << " -> " << out << "\n";
    }
    cout << "\n";
}